

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O0

void __thiscall
JSON::Node::Node(Node *this,string *type,vector<JSON::Node,_std::allocator<JSON::Node>_> *children,
                int start,int end)

{
  int end_local;
  int start_local;
  vector<JSON::Node,_std::allocator<JSON::Node>_> *children_local;
  string *type_local;
  Node *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)type);
  this->start = start;
  this->end = end;
  std::__cxx11::string::string((string *)&this->rawValue);
  std::vector<JSON::Node,_std::allocator<JSON::Node>_>::vector(&this->children,children);
  return;
}

Assistant:

Node(string type, vector<Node> children, int start, int end)
                : type(type), children(children), start(start), end(end) {
        }